

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mustache.cpp
# Opt level: O2

void __thiscall TestMustache::testSections(TestMustache *this)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  QVariant *pQVar5;
  QVariantHash map;
  anon_union_24_3_e3d07ef4_for_data local_198;
  QVariant local_170;
  QtVariantContext context;
  QArrayDataPointer<char16_t> local_128;
  QHash<QString,_QVariant> local_110;
  QVariantList contacts;
  QString expectedOutput;
  QString _template;
  Renderer renderer;
  
  QString::QString((QString *)&renderer,"John Smith");
  QString::QString((QString *)&context,"john.smith@gmail.com");
  contactInfo((QString *)&map,(QString *)&renderer);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&context);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&renderer);
  contacts.d.d = (Data *)0x0;
  contacts.d.ptr = (QVariant *)0x0;
  contacts.d.size = 0;
  QString::QString((QString *)&context,"James Dee");
  QString::QString((QString *)&local_198,"james@dee.org");
  contactInfo((QString *)&local_170,(QString *)&context);
  ::QVariant::QVariant((QVariant *)&renderer,(QHash *)&local_170);
  QList<QVariant>::emplaceBack<QVariant>(&contacts,(QVariant *)&renderer);
  ::QVariant::~QVariant((QVariant *)&renderer);
  QHash<QString,_QVariant>::~QHash((QHash<QString,_QVariant> *)&local_170);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_198);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&context);
  QString::QString((QString *)&context,"Jim Jones");
  QString::QString((QString *)&local_198,"jim-jones@yahoo.com");
  contactInfo((QString *)&local_170,(QString *)&context);
  ::QVariant::QVariant((QVariant *)&renderer,(QHash *)&local_170);
  QList<QVariant>::emplaceBack<QVariant>(&contacts,(QVariant *)&renderer);
  ::QVariant::~QVariant((QVariant *)&renderer);
  QHash<QString,_QVariant>::~QHash((QHash<QString,_QVariant> *)&local_170);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_198);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&context);
  ::QVariant::QVariant((QVariant *)&renderer,(QList *)&contacts);
  QString::QString((QString *)&context,"contacts");
  pQVar5 = QHash<QString,_QVariant>::operator[](&map,(QString *)&context);
  ::QVariant::operator=(pQVar5,(QVariant *)&renderer);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&context);
  ::QVariant::~QVariant((QVariant *)&renderer);
  QString::QString(&_template,
                   "Name: {{name}}, Email: {{email}}\n{{#contacts}}  {{name}} - {{email}}\n{{/contacts}}{{^contacts}}  No contacts{{/contacts}}"
                  );
  QString::QString(&expectedOutput,
                   "Name: John Smith, Email: john.smith@gmail.com\n  James Dee - james@dee.org\n  Jim Jones - jim-jones@yahoo.com\n"
                  );
  Mustache::Renderer::Renderer(&renderer);
  ::QVariant::QVariant((QVariant *)&local_198,(QHash *)&map);
  Mustache::QtVariantContext::QtVariantContext
            (&context,(QVariant *)&local_198,(PartialResolver *)0x0);
  ::QVariant::~QVariant((QVariant *)&local_198);
  Mustache::Renderer::render((QString *)&local_128,&renderer,&_template,&context.super_Context);
  bVar4 = QTest::qCompare((QString *)&local_128,&expectedOutput,"output","expectedOutput",
                          "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                          ,0x68);
  if (bVar4) {
    QString::QString((QString *)&local_198,"contacts");
    QHash<QString,_QVariant>::remove(&map,(char *)local_198.data);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_198);
    ::QVariant::QVariant(&local_170,(QHash *)&map);
    Mustache::QtVariantContext::QtVariantContext
              ((QtVariantContext *)&local_198,&local_170,(PartialResolver *)0x0);
    Mustache::QtVariantContext::operator=(&context,(QtVariantContext *)&local_198);
    Mustache::QtVariantContext::~QtVariantContext((QtVariantContext *)&local_198);
    ::QVariant::~QVariant(&local_170);
    Mustache::Renderer::render((QString *)&local_198,&renderer,&_template,&context.super_Context);
    qVar3 = local_128.size;
    pcVar2 = local_128.ptr;
    pDVar1 = local_128.d;
    local_128.d = (Data *)local_198.shared;
    local_128.ptr = (char16_t *)local_198._8_8_;
    local_198.shared = (PrivateShared *)pDVar1;
    local_198._8_8_ = pcVar2;
    local_128.size = local_198._16_8_;
    local_198._16_8_ = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_198);
    QString::operator=(&expectedOutput,
                       "Name: John Smith, Email: john.smith@gmail.com\n  No contacts");
    bVar4 = QTest::qCompare((QString *)&local_128,&expectedOutput,"output","expectedOutput",
                            "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                            ,0x71);
    if (bVar4) {
      local_110.d = (Data *)0x0;
      ::QVariant::QVariant((QVariant *)&local_198,(QHash *)&local_110);
      QString::QString((QString *)&local_170,"contacts");
      pQVar5 = QHash<QString,_QVariant>::operator[](&map,(QString *)&local_170);
      ::QVariant::operator=(pQVar5,(QVariant *)&local_198);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_170);
      ::QVariant::~QVariant((QVariant *)&local_198);
      QHash<QString,_QVariant>::~QHash(&local_110);
      ::QVariant::QVariant(&local_170,(QHash *)&map);
      Mustache::QtVariantContext::QtVariantContext
                ((QtVariantContext *)&local_198,&local_170,(PartialResolver *)0x0);
      Mustache::QtVariantContext::operator=(&context,(QtVariantContext *)&local_198);
      Mustache::QtVariantContext::~QtVariantContext((QtVariantContext *)&local_198);
      ::QVariant::~QVariant(&local_170);
      Mustache::Renderer::render((QString *)&local_198,&renderer,&_template,&context.super_Context);
      qVar3 = local_128.size;
      pcVar2 = local_128.ptr;
      pDVar1 = local_128.d;
      local_128.d = (Data *)local_198.shared;
      local_128.ptr = (char16_t *)local_198._8_8_;
      local_198.shared = (PrivateShared *)pDVar1;
      local_198._8_8_ = pcVar2;
      local_128.size = local_198._16_8_;
      local_198._16_8_ = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_198);
      QTest::qCompare((QString *)&local_128,&expectedOutput,"output","expectedOutput",
                      "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                      ,0x77);
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
  Mustache::QtVariantContext::~QtVariantContext(&context);
  Mustache::Renderer::~Renderer(&renderer);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&expectedOutput.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&_template.d);
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&contacts.d);
  QHash<QString,_QVariant>::~QHash(&map);
  return;
}

Assistant:

void TestMustache::testSections()
{
	QVariantHash map = contactInfo("John Smith", "john.smith@gmail.com");
	QVariantList contacts;
	contacts << contactInfo("James Dee", "james@dee.org");
	contacts << contactInfo("Jim Jones", "jim-jones@yahoo.com");
	map["contacts"] = contacts;

	QString _template = "Name: {{name}}, Email: {{email}}\n"
	                    "{{#contacts}}  {{name}} - {{email}}\n{{/contacts}}"
	                    "{{^contacts}}  No contacts{{/contacts}}";

	QString expectedOutput = "Name: John Smith, Email: john.smith@gmail.com\n"
	                         "  James Dee - james@dee.org\n"
	                         "  Jim Jones - jim-jones@yahoo.com\n";

	Mustache::Renderer renderer;
	Mustache::QtVariantContext context(map);
	QString output = renderer.render(_template, &context);

	QCOMPARE(output, expectedOutput);

	// test inverted sections
	map.remove("contacts");
	context = Mustache::QtVariantContext(map);
	output = renderer.render(_template, &context);

	expectedOutput = "Name: John Smith, Email: john.smith@gmail.com\n"
	                 "  No contacts";
	QCOMPARE(output, expectedOutput);

	// test with an empty list instead of an empty key
	map["contacts"] = QVariantHash();
	context = Mustache::QtVariantContext(map);
	output = renderer.render(_template, &context);
	QCOMPARE(output, expectedOutput);
}